

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::SharedCtor
          (FeatureSetDefaults_FeatureSetEditionDefault *this,Arena *arena)

{
  Arena *arena_local;
  FeatureSetDefaults_FeatureSetEditionDefault *this_local;
  
  MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 8),0,0x14);
  return;
}

Assistant:

inline void FeatureSetDefaults_FeatureSetEditionDefault::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, overridable_features_),
           0,
           offsetof(Impl_, edition_) -
               offsetof(Impl_, overridable_features_) +
               sizeof(Impl_::edition_));
}